

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  uint *puVar1;
  long lVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  lVar2 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar2 + 1] == '\0') {
    std::ios::widen((char)asStack_1a8 + (char)lVar2 + '\x10');
    acStack_b8[lVar2 + 1] = '\x01';
  }
  acStack_b8[lVar2] = '0';
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}